

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall sznet::net::EventLoop::~EventLoop(EventLoop *this)

{
  ~EventLoop(this);
  operator_delete(this);
  return;
}

Assistant:

EventLoop::~EventLoop()
{
	LOG_DEBUG << "EventLoop " << this << " of thread " << m_threadId
		<< " destructs in thread " << CurrentThread::tid();
	assertInLoopThread();
	for (const Functor& functor : m_pendingFunctors)
	{
		functor();
	}
	// 停止fd所有事件
	m_wakeupChannel->disableAll();
	// poll中也移除
	m_wakeupChannel->remove();
	sockets::sz_close_eventfd(m_wakeupFd);
	t_loopInThisThread = nullptr;
}